

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demangle.cc
# Opt level: O1

bool absl::debugging_internal::ParseSourceName(State *state)

{
  char *str;
  int iVar1;
  int iVar2;
  int iVar3;
  char *pcVar4;
  bool bVar5;
  long lVar6;
  long lVar7;
  char cVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  int length;
  ParseState copy;
  int local_2c;
  undefined8 local_28;
  undefined8 uStack_20;
  
  iVar1 = state->recursion_depth;
  iVar2 = state->steps;
  state->recursion_depth = iVar1 + 1;
  state->steps = iVar2 + 1;
  if (iVar2 < 0x20000 && iVar1 < 0x100) {
    local_28._0_4_ = (state->parse_state).mangled_idx;
    local_28._4_4_ = (state->parse_state).out_cur_idx;
    uStack_20 = *(undefined8 *)&(state->parse_state).prev_name_idx;
    local_2c = -1;
    bVar5 = ParseNumber(state,&local_2c);
    iVar1 = local_2c;
    if (bVar5) {
      uVar11 = (ulong)local_2c;
      iVar2 = state->recursion_depth;
      iVar3 = state->steps;
      state->recursion_depth = iVar2 + 1;
      state->steps = iVar3 + 1;
      if (((-1 < (long)uVar11) && (iVar2 < 0x100)) && (iVar3 < 0x20000)) {
        pcVar4 = state->mangled_begin;
        lVar7 = (long)(state->parse_state).mangled_idx;
        str = pcVar4 + lVar7;
        bVar5 = local_2c < 1;
        if (0 < local_2c) {
          if (*str == '\0') goto LAB_0014d009;
          uVar9 = 0;
          do {
            uVar10 = uVar11;
            if (uVar11 - 1 == uVar9) break;
            uVar10 = uVar9 + 1;
            lVar6 = uVar9 + lVar7 + 1;
            uVar9 = uVar10;
          } while (pcVar4[lVar6] != '\0');
          bVar5 = uVar11 <= uVar10;
        }
        if (bVar5) {
          if (local_2c < 0xc) {
LAB_0014d034:
            MaybeAppendWithLength(state,str,local_2c);
          }
          else {
            cVar8 = *str;
            if (cVar8 == '\0') {
              lVar6 = 0;
            }
            else {
              lVar6 = 0;
              do {
                if (cVar8 != (&IdentifierIsAnonymousNamespace(absl::debugging_internal::State*,int)
                               ::anon_prefix)[lVar6]) break;
                cVar8 = pcVar4[lVar6 + lVar7 + 1];
                lVar6 = lVar6 + 1;
              } while (cVar8 != '\0');
            }
            if ((&IdentifierIsAnonymousNamespace(absl::debugging_internal::State*,int)::anon_prefix)
                [lVar6] != '\0') goto LAB_0014d034;
            MaybeAppend(state,"(anonymous namespace)");
          }
          (state->parse_state).mangled_idx = (state->parse_state).mangled_idx + iVar1;
          state->recursion_depth = state->recursion_depth + -1;
          bVar5 = true;
          goto LAB_0014d01a;
        }
      }
LAB_0014d009:
      state->recursion_depth = state->recursion_depth + -1;
    }
    (state->parse_state).mangled_idx = (undefined4)local_28;
    (state->parse_state).out_cur_idx = local_28._4_4_;
    *(undefined8 *)&(state->parse_state).prev_name_idx = uStack_20;
  }
  bVar5 = false;
LAB_0014d01a:
  state->recursion_depth = state->recursion_depth + -1;
  return bVar5;
}

Assistant:

static bool ParseSourceName(State *state) {
  ComplexityGuard guard(state);
  if (guard.IsTooComplex()) return false;
  ParseState copy = state->parse_state;
  int length = -1;
  if (ParseNumber(state, &length) && ParseIdentifier(state, length)) {
    return true;
  }
  state->parse_state = copy;
  return false;
}